

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3CodeRhsOfIN(Parse *pParse,Expr *pExpr,int iTab)

{
  byte *pbVar1;
  byte bVar2;
  Vdbe *p;
  Expr *pEVar3;
  ExprList *pEVar4;
  uint uVar5;
  int target;
  int p3;
  int iVar6;
  KeyInfo *p_00;
  Select *pSVar7;
  CollSeq *pCVar8;
  Expr *pLeft;
  int iVar9;
  int iVar10;
  char *pcVar11;
  ulong uVar12;
  ExprList_item *pEVar13;
  ExprList **ppEVar14;
  ulong uVar15;
  int local_90;
  char affinity;
  int local_54;
  undefined8 local_50;
  int local_48;
  char *local_40;
  
  p = pParse->pVdbe;
  uVar5 = pExpr->flags;
  local_90 = 0;
  if (((uVar5 & 0x40) == 0) && (pParse->iSelfTab == 0)) {
    if ((uVar5 >> 0x19 & 1) != 0) {
      iVar9 = sqlite3VdbeAddOp0(p,0xf);
      if ((pExpr->flags & 0x1000) != 0) {
        sqlite3VdbeExplain(pParse,'\0',"REUSE LIST SUBQUERY %d",(ulong)((pExpr->x).pSelect)->selId);
      }
      sqlite3VdbeAddOp2(p,10,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr);
      sqlite3VdbeAddOp2(p,0x73,iTab,pExpr->iTable);
      sqlite3VdbeJumpHere(p,iVar9);
      return;
    }
    pExpr->flags = uVar5 | 0x2000000;
    iVar9 = pParse->nMem + 1;
    pParse->nMem = iVar9;
    (pExpr->y).sub.regReturn = iVar9;
    iVar9 = sqlite3VdbeAddOp2(p,0x4a,0,iVar9);
    (pExpr->y).sub.iAddr = iVar9 + 1;
    local_90 = sqlite3VdbeAddOp0(p,0xf);
  }
  pEVar3 = pExpr->pLeft;
  uVar5 = sqlite3ExprVectorSize(pEVar3);
  pExpr->iTable = iTab;
  iVar9 = sqlite3VdbeAddOp2(p,0x76,iTab,uVar5);
  p_00 = sqlite3KeyInfoAlloc(pParse->db,uVar5,1);
  pSVar7 = (pExpr->x).pSelect;
  if ((pExpr->flags & 0x1000) == 0) {
    if (pSVar7 != (Select *)0x0) {
      affinity = sqlite3ExprAffinity(pEVar3);
      if (affinity < 'A') {
        affinity = 'A';
      }
      else if (affinity == 'E') {
        affinity = 'C';
      }
      if (p_00 != (KeyInfo *)0x0) {
        pCVar8 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
        p_00->aColl[0] = pCVar8;
      }
      target = sqlite3GetTempReg(pParse);
      p3 = sqlite3GetTempReg(pParse);
      iVar10._0_1_ = pSVar7->op;
      iVar10._1_1_ = pSVar7->field_0x1;
      iVar10._2_2_ = pSVar7->nSelectRow;
      ppEVar14 = (ExprList **)&pSVar7->iLimit;
      for (; 0 < iVar10; iVar10 = iVar10 + -1) {
        pEVar3 = (Expr *)*ppEVar14;
        if (local_90 == 0) {
LAB_00198c88:
          local_90 = 0;
        }
        else {
          iVar6 = sqlite3ExprIsConstant(pEVar3);
          if (iVar6 == 0) {
            sqlite3VdbeChangeToNoop(p,local_90 + -1);
            sqlite3VdbeChangeToNoop(p,local_90);
            pbVar1 = (byte *)((long)&pExpr->flags + 3);
            *pbVar1 = *pbVar1 & 0xfd;
            goto LAB_00198c88;
          }
        }
        sqlite3ExprCode(pParse,pEVar3,target);
        sqlite3VdbeAddOp4(p,0x61,target,1,p3,&affinity,1);
        sqlite3VdbeAddOp4Int(p,0x8a,iTab,p3,target,1);
        ppEVar14 = ppEVar14 + 3;
      }
      if (target != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = target;
        }
      }
      if (p3 != 0) {
        bVar2 = pParse->nTempReg;
        if ((ulong)bVar2 < 8) {
          pParse->nTempReg = bVar2 + 1;
          pParse->aTempReg[bVar2] = p3;
        }
      }
    }
  }
  else {
    pEVar4 = pSVar7->pEList;
    pcVar11 = "";
    if (local_90 == 0) {
      pcVar11 = "CORRELATED ";
    }
    sqlite3VdbeExplain(pParse,'\x01',"%sLIST SUBQUERY %d",pcVar11,(ulong)pSVar7->selId);
    if (pEVar4->nExpr == uVar5) {
      affinity = '\v';
      local_50._0_4_ = 0;
      local_50._4_4_ = 0;
      local_48 = 0;
      local_54 = iTab;
      local_40 = exprINAffinity(pParse,pExpr);
      pSVar7->iLimit = 0;
      pSVar7 = sqlite3SelectDup(pParse->db,pSVar7,0);
      if (pParse->db->mallocFailed == '\0') {
        iVar10 = sqlite3Select(pParse,pSVar7,(SelectDest *)&affinity);
        sqlite3SelectDelete(pParse->db,pSVar7);
        sqlite3DbFree(pParse->db,local_40);
        if (iVar10 == 0) {
          pEVar13 = pEVar4->a;
          uVar15 = 0;
          uVar12 = (ulong)uVar5;
          if ((int)uVar5 < 1) {
            uVar12 = uVar15;
          }
          for (; uVar12 != uVar15; uVar15 = uVar15 + 1) {
            pLeft = sqlite3VectorFieldSubexpr(pEVar3,(int)uVar15);
            pCVar8 = sqlite3BinaryCompareCollSeq(pParse,pLeft,pEVar13->pExpr);
            p_00->aColl[uVar15] = pCVar8;
            pEVar13 = pEVar13 + 1;
          }
          goto LAB_00198d54;
        }
      }
      else {
        sqlite3SelectDelete(pParse->db,pSVar7);
        sqlite3DbFree(pParse->db,local_40);
      }
      sqlite3KeyInfoUnref(p_00);
      return;
    }
  }
LAB_00198d54:
  if (p_00 != (KeyInfo *)0x0) {
    sqlite3VdbeChangeP4(p,iVar9,(char *)p_00,-8);
  }
  if (local_90 != 0) {
    sqlite3VdbeAddOp1(p,0x88,iTab);
    sqlite3VdbeJumpHere(p,local_90);
    sqlite3VdbeAddOp3(p,0x43,(pExpr->y).sub.regReturn,(pExpr->y).sub.iAddr,1);
    pParse->nTempReg = '\0';
    pParse->nRangeReg = 0;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRhsOfIN(
  Parse *pParse,          /* Parsing context */
  Expr *pExpr,            /* The IN operator */
  int iTab                /* Use this cursor number */
){
  int addrOnce = 0;           /* Address of the OP_Once instruction at top */
  int addr;                   /* Address of OP_OpenEphemeral instruction */
  Expr *pLeft;                /* the LHS of the IN operator */
  KeyInfo *pKeyInfo = 0;      /* Key information */
  int nVal;                   /* Size of vector pLeft */
  Vdbe *v;                    /* The prepared statement under construction */

  v = pParse->pVdbe;
  assert( v!=0 );

  /* The evaluation of the IN must be repeated every time it
  ** is encountered if any of the following is true:
  **
  **    *  The right-hand side is a correlated subquery
  **    *  The right-hand side is an expression list containing variables
  **    *  We are inside a trigger
  **
  ** If all of the above are false, then we can compute the RHS just once
  ** and reuse it many names.
  */
  if( !ExprHasProperty(pExpr, EP_VarSelect) && pParse->iSelfTab==0 ){
    /* Reuse of the RHS is allowed */
    /* If this routine has already been coded, but the previous code
    ** might not have been invoked yet, so invoke it now as a subroutine.
    */
    if( ExprHasProperty(pExpr, EP_Subrtn) ){
      addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      if( ExprUseXSelect(pExpr) ){
        ExplainQueryPlan((pParse, 0, "REUSE LIST SUBQUERY %d",
              pExpr->x.pSelect->selId));
      }
      assert( ExprUseYSub(pExpr) );
      sqlite3VdbeAddOp2(v, OP_Gosub, pExpr->y.sub.regReturn,
                        pExpr->y.sub.iAddr);
      assert( iTab!=pExpr->iTable );
      sqlite3VdbeAddOp2(v, OP_OpenDup, iTab, pExpr->iTable);
      sqlite3VdbeJumpHere(v, addrOnce);
      return;
    }

    /* Begin coding the subroutine */
    assert( !ExprUseYWin(pExpr) );
    ExprSetProperty(pExpr, EP_Subrtn);
    assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
    pExpr->y.sub.regReturn = ++pParse->nMem;
    pExpr->y.sub.iAddr =
      sqlite3VdbeAddOp2(v, OP_BeginSubrtn, 0, pExpr->y.sub.regReturn) + 1;

    addrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
  }

  /* Check to see if this is a vector IN operator */
  pLeft = pExpr->pLeft;
  nVal = sqlite3ExprVectorSize(pLeft);

  /* Construct the ephemeral table that will contain the content of
  ** RHS of the IN operator.
  */
  pExpr->iTable = iTab;
  addr = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, pExpr->iTable, nVal);
#ifdef SQLITE_ENABLE_EXPLAIN_COMMENTS
  if( ExprUseXSelect(pExpr) ){
    VdbeComment((v, "Result of SELECT %u", pExpr->x.pSelect->selId));
  }else{
    VdbeComment((v, "RHS of IN operator"));
  }
#endif
  pKeyInfo = sqlite3KeyInfoAlloc(pParse->db, nVal, 1);

  if( ExprUseXSelect(pExpr) ){
    /* Case 1:     expr IN (SELECT ...)
    **
    ** Generate code to write the results of the select into the temporary
    ** table allocated and opened above.
    */
    Select *pSelect = pExpr->x.pSelect;
    ExprList *pEList = pSelect->pEList;

    ExplainQueryPlan((pParse, 1, "%sLIST SUBQUERY %d",
        addrOnce?"":"CORRELATED ", pSelect->selId
    ));
    /* If the LHS and RHS of the IN operator do not match, that
    ** error will have been caught long before we reach this point. */
    if( ALWAYS(pEList->nExpr==nVal) ){
      Select *pCopy;
      SelectDest dest;
      int i;
      int rc;
      sqlite3SelectDestInit(&dest, SRT_Set, iTab);
      dest.zAffSdst = exprINAffinity(pParse, pExpr);
      pSelect->iLimit = 0;
      testcase( pSelect->selFlags & SF_Distinct );
      testcase( pKeyInfo==0 ); /* Caused by OOM in sqlite3KeyInfoAlloc() */
      pCopy = sqlite3SelectDup(pParse->db, pSelect, 0);
      rc = pParse->db->mallocFailed ? 1 :sqlite3Select(pParse, pCopy, &dest);
      sqlite3SelectDelete(pParse->db, pCopy);
      sqlite3DbFree(pParse->db, dest.zAffSdst);
      if( rc ){
        sqlite3KeyInfoUnref(pKeyInfo);
        return;
      }
      assert( pKeyInfo!=0 ); /* OOM will cause exit after sqlite3Select() */
      assert( pEList!=0 );
      assert( pEList->nExpr>0 );
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      for(i=0; i<nVal; i++){
        Expr *p = sqlite3VectorFieldSubexpr(pLeft, i);
        pKeyInfo->aColl[i] = sqlite3BinaryCompareCollSeq(
            pParse, p, pEList->a[i].pExpr
        );
      }
    }
  }else if( ALWAYS(pExpr->x.pList!=0) ){
    /* Case 2:     expr IN (exprlist)
    **
    ** For each expression, build an index key from the evaluation and
    ** store it in the temporary table. If <expr> is a column, then use
    ** that columns affinity when building index keys. If <expr> is not
    ** a column, use numeric affinity.
    */
    char affinity;            /* Affinity of the LHS of the IN */
    int i;
    ExprList *pList = pExpr->x.pList;
    struct ExprList_item *pItem;
    int r1, r2;
    affinity = sqlite3ExprAffinity(pLeft);
    if( affinity<=SQLITE_AFF_NONE ){
      affinity = SQLITE_AFF_BLOB;
    }else if( affinity==SQLITE_AFF_REAL ){
      affinity = SQLITE_AFF_NUMERIC;
    }
    if( pKeyInfo ){
      assert( sqlite3KeyInfoIsWriteable(pKeyInfo) );
      pKeyInfo->aColl[0] = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    }

    /* Loop through each expression in <exprlist>. */
    r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3GetTempReg(pParse);
    for(i=pList->nExpr, pItem=pList->a; i>0; i--, pItem++){
      Expr *pE2 = pItem->pExpr;

      /* If the expression is not constant then we will need to
      ** disable the test that was generated above that makes sure
      ** this code only executes once.  Because for a non-constant
      ** expression we need to rerun this code each time.
      */
      if( addrOnce && !sqlite3ExprIsConstant(pE2) ){
        sqlite3VdbeChangeToNoop(v, addrOnce-1);
        sqlite3VdbeChangeToNoop(v, addrOnce);
        ExprClearProperty(pExpr, EP_Subrtn);
        addrOnce = 0;
      }

      /* Evaluate the expression and insert it into the temp table */
      sqlite3ExprCode(pParse, pE2, r1);
      sqlite3VdbeAddOp4(v, OP_MakeRecord, r1, 1, r2, &affinity, 1);
      sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iTab, r2, r1, 1);
    }
    sqlite3ReleaseTempReg(pParse, r1);
    sqlite3ReleaseTempReg(pParse, r2);
  }
  if( pKeyInfo ){
    sqlite3VdbeChangeP4(v, addr, (void *)pKeyInfo, P4_KEYINFO);
  }
  if( addrOnce ){
    sqlite3VdbeAddOp1(v, OP_NullRow, iTab);
    sqlite3VdbeJumpHere(v, addrOnce);
    /* Subroutine return */
    assert( ExprUseYSub(pExpr) );
    assert( sqlite3VdbeGetOp(v,pExpr->y.sub.iAddr-1)->opcode==OP_BeginSubrtn
            || pParse->nErr );
    sqlite3VdbeAddOp3(v, OP_Return, pExpr->y.sub.regReturn,
                      pExpr->y.sub.iAddr, 1);
    VdbeCoverage(v);
    sqlite3ClearTempRegCache(pParse);
  }
}